

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

void __thiscall
QHeaderViewPrivate::resizeSections
          (QHeaderViewPrivate *this,ResizeMode globalMode,bool useGlobalMode)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ResizeMode RVar4;
  int iVar5;
  HeaderMode HVar6;
  QHeaderViewPrivate *pQVar7;
  int *piVar8;
  byte in_DL;
  HeaderMode in_ESI;
  QHeaderViewPrivate *in_RDI;
  long in_FS_OFFSET;
  ResizeMode resizeMode_1;
  ResizeMode newSectionResizeMode;
  int newSectionLength;
  int oldSectionLength;
  int i_1;
  ResizeMode previousSectionResizeMode;
  int previousSectionLength;
  int spanStartSection;
  int pixelReminder;
  int logicalIndex;
  ResizeMode resizeMode;
  int i;
  int numberOfStretchedSections;
  int lengthToStretch;
  int stretchSection;
  int lastSectionVisualIdx;
  QHeaderView *q;
  int hintLengthForEveryStretchedSection;
  int stretchSectionLength;
  int sectionSize;
  QList<int> section_sizes;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  QHeaderViewPrivate *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  HeaderMode in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  ResizeMode mode;
  HeaderMode in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  ResizeMode end;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff58;
  HeaderMode HVar9;
  undefined4 in_stack_ffffffffffffff5c;
  int local_a0;
  ResizeMode local_98;
  HeaderMode local_94;
  int local_90;
  ResizeMode local_8c;
  int local_88;
  HeaderMode local_80;
  ResizeMode local_7c;
  int local_78;
  int local_74;
  ResizeMode local_70;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  pQVar7 = (QHeaderViewPrivate *)q_func(in_RDI);
  QBasicTimer::stop();
  QAbstractItemViewPrivate::executePostedLayout
            (&in_stack_ffffffffffffff30->super_QAbstractItemViewPrivate);
  bVar2 = noSectionMemoryUsage(in_RDI);
  if ((bVar2) &&
     ((bVar2 = hasAutoResizeSections(in_RDI), bVar2 ||
      ((bVar1 != 0 && (in_RDI->globalResizeMode != Custom)))))) {
    setHeaderMode((QHeaderViewPrivate *)
                  CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                  in_stack_ffffffffffffff44);
  }
  iVar3 = sectionCount(in_stack_ffffffffffffff30);
  if ((iVar3 != 0) && ((in_RDI->resizeRecursionBlock & 1U) == 0)) {
    in_RDI->resizeRecursionBlock = true;
    invalidateCachedSizeHint(in_stack_ffffffffffffff30);
    RVar4 = QHeaderView::visualIndex
                      ((QHeaderView *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                       (int)((ulong)in_RDI >> 0x20));
    local_70 = ~Interactive;
    if (((in_RDI->stretchLastSection & 1U) != 0) && (bVar1 == 0)) {
      local_70 = RVar4;
    }
    if (in_RDI->orientation == Horizontal) {
      local_74 = QWidget::width((QWidget *)0x83751b);
    }
    else {
      local_74 = QWidget::height((QWidget *)0x837532);
    }
    local_78 = 0;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    iVar3 = local_74;
    QList<int>::QList((QList<int> *)0x837580);
    local_7c = Interactive;
    while (end = local_7c, iVar5 = sectionCount(in_stack_ffffffffffffff30), (int)end < iVar5) {
      bVar2 = isVisualIndexHidden(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      if (!bVar2) {
        if ((bVar1 == 0) || (local_80 = in_ESI, local_7c == local_70)) {
          if (local_7c == local_70) {
            in_stack_ffffffffffffff44 = FlexibleWithSectionMemoryUsage;
            local_80 = in_stack_ffffffffffffff44;
          }
          else {
            in_stack_ffffffffffffff44 =
                 headerSectionResizeMode
                           ((QHeaderViewPrivate *)
                            CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                            (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
            local_80 = in_stack_ffffffffffffff44;
          }
        }
        iVar5 = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
        if (local_80 == FlexibleWithSectionMemoryUsage) {
          local_78 = local_78 + 1;
          headerSectionSize((QHeaderViewPrivate *)
                            CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),iVar5);
          QList<int>::append((QList<int> *)0x837642,in_stack_ffffffffffffff2c);
        }
        else {
          local_24 = 0;
          if ((local_80 == InitialNoSectionMemoryUsage) || (local_80 == 2)) {
            local_28 = QHeaderView::minimumSectionSize
                                 ((QHeaderView *)
                                  CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
            local_2c = headerSectionSize((QHeaderViewPrivate *)
                                         CONCAT44(in_stack_ffffffffffffff3c,
                                                  in_stack_ffffffffffffff38),
                                         (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
            local_30 = QHeaderView::maximumSectionSize
                                 ((QHeaderView *)
                                  CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
            piVar8 = qBound<int>((int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                                                ),
                                 (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38
                                                ),(int *)in_stack_ffffffffffffff30);
            local_24 = *piVar8;
          }
          else {
            QHeaderView::logicalIndex
                      ((QHeaderView *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       iVar5);
            local_34 = viewSectionSizeHint((QHeaderViewPrivate *)CONCAT44(iVar3,end),
                                           in_stack_ffffffffffffff44);
            local_38 = QHeaderView::sectionSizeHint((QHeaderView *)in_RDI,iVar3);
            piVar8 = qMax<int>(&local_34,&local_38);
            local_24 = *piVar8;
          }
          local_3c = QHeaderView::minimumSectionSize
                               ((QHeaderView *)
                                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          local_40 = QHeaderView::maximumSectionSize
                               ((QHeaderView *)
                                CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          piVar8 = qBound<int>((int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                               (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               (int *)in_stack_ffffffffffffff30);
          local_24 = *piVar8;
          QList<int>::append((QList<int> *)0x837775,in_stack_ffffffffffffff2c);
          local_74 = local_74 - local_24;
        }
      }
      local_7c = local_7c + Stretch;
    }
    local_44 = -1;
    local_88 = 0;
    if ((0 < local_78) && (0 < local_74)) {
      local_48 = local_74 / local_78;
      local_4c = QHeaderView::minimumSectionSize
                           ((QHeaderView *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      piVar8 = qMax<int>(&local_48,&local_4c);
      local_44 = *piVar8;
      local_88 = local_74 % local_78;
    }
    local_8c = Interactive;
    local_90 = 0;
    local_94 = InitialNoSectionMemoryUsage;
    local_98 = Interactive;
    while (mode = local_98, iVar5 = sectionCount(in_stack_ffffffffffffff30), (int)mode < iVar5) {
      iVar5 = headerSectionSize((QHeaderViewPrivate *)
                                CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      HVar6 = headerSectionResizeMode
                        ((QHeaderViewPrivate *)
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                         (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      bVar2 = isVisualIndexHidden(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      if (bVar2) {
        local_a0 = 0;
      }
      else {
        HVar9 = in_ESI;
        if ((bVar1 == 0) && (in_stack_ffffffffffffff3c = HVar6, HVar9 = HVar6, local_98 == local_70)
           ) {
          in_stack_ffffffffffffff3c = FlexibleWithSectionMemoryUsage;
          HVar9 = FlexibleWithSectionMemoryUsage;
        }
        if ((HVar9 == FlexibleWithSectionMemoryUsage) && (local_44 != -1)) {
          if (local_98 == RVar4) {
            piVar8 = qMax<int>(&local_44,&in_RDI->lastSectionSize);
            local_a0 = *piVar8;
          }
          else {
            local_a0 = local_44;
          }
          if (0 < local_88) {
            local_a0 = local_a0 + 1;
            local_88 = local_88 + -1;
          }
          QList<int>::removeFirst((QList<int> *)in_stack_ffffffffffffff30);
        }
        else {
          local_a0 = QList<int>::takeFirst((QList<int> *)in_stack_ffffffffffffff30);
        }
      }
      if (((local_94 != HVar6) || (local_90 != local_a0)) && (0 < (int)local_98)) {
        createSectionItems(in_RDI,iVar3,end,in_stack_ffffffffffffff44,mode);
        local_8c = local_98;
      }
      if (local_a0 != iVar5) {
        in_stack_ffffffffffffff30 = pQVar7;
        QHeaderViewPrivate::logicalIndex
                  ((QHeaderViewPrivate *)CONCAT44(in_stack_ffffffffffffff44,mode),
                   in_stack_ffffffffffffff3c);
        QHeaderView::sectionResized
                  ((QHeaderView *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                   in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                   (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      }
      local_90 = local_a0;
      local_98 = local_98 + Stretch;
      local_94 = HVar6;
    }
    sectionCount(in_stack_ffffffffffffff30);
    createSectionItems(in_RDI,iVar3,end,in_stack_ffffffffffffff44,mode);
    in_RDI->resizeRecursionBlock = false;
    QWidget::update((QWidget *)CONCAT44(local_8c,in_stack_ffffffffffffff28));
    QList<int>::~QList((QList<int> *)0x837a3e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHeaderViewPrivate::resizeSections(QHeaderView::ResizeMode globalMode, bool useGlobalMode)
{
    Q_Q(QHeaderView);
    //stop the timer in case it is delayed
    delayedResize.stop();

    executePostedLayout();

    if (noSectionMemoryUsage() &&
       (hasAutoResizeSections() || (useGlobalMode && globalResizeMode != QHeaderView::Fixed))) {
        setHeaderMode(HeaderMode::FlexibleWithSectionMemoryUsage);
    }

    if (sectionCount() == 0 )
        return;

    if (resizeRecursionBlock)
        return;
    resizeRecursionBlock = true;

    invalidateCachedSizeHint();
    const int lastSectionVisualIdx = q->visualIndex(lastSectionLogicalIdx);

    // find stretchLastSection if we have it
    int stretchSection = -1;
    if (stretchLastSection && !useGlobalMode)
        stretchSection = lastSectionVisualIdx;

    // count up the number of stretched sections and how much space left for them
    int lengthToStretch = (orientation == Qt::Horizontal ? viewport->width() : viewport->height());
    int numberOfStretchedSections = 0;
    QList<int> section_sizes;
    for (int i = 0; i < sectionCount(); ++i) {
        if (isVisualIndexHidden(i))
            continue;

        QHeaderView::ResizeMode resizeMode;
        if (useGlobalMode && (i != stretchSection))
            resizeMode = globalMode;
        else
            resizeMode = (i == stretchSection ? QHeaderView::Stretch : headerSectionResizeMode(i));

        if (resizeMode == QHeaderView::Stretch) {
            ++numberOfStretchedSections;
            section_sizes.append(headerSectionSize(i));
            continue;
        }

        // because it isn't stretch, determine its width and remove that from lengthToStretch
        int sectionSize = 0;
        if (resizeMode == QHeaderView::Interactive || resizeMode == QHeaderView::Fixed) {
            sectionSize = qBound(q->minimumSectionSize(), headerSectionSize(i), q->maximumSectionSize());
        } else { // resizeMode == QHeaderView::ResizeToContents
            int logicalIndex = q->logicalIndex(i);
            sectionSize = qMax(viewSectionSizeHint(logicalIndex),
                               q->sectionSizeHint(logicalIndex));
        }
        sectionSize = qBound(q->minimumSectionSize(),
                             sectionSize,
                             q->maximumSectionSize());

        section_sizes.append(sectionSize);
        lengthToStretch -= sectionSize;
    }

    // calculate the new length for all of the stretched sections
    int stretchSectionLength = -1;
    int pixelReminder = 0;
    if (numberOfStretchedSections > 0 && lengthToStretch > 0) { // we have room to stretch in
        int hintLengthForEveryStretchedSection = lengthToStretch / numberOfStretchedSections;
        stretchSectionLength = qMax(hintLengthForEveryStretchedSection, q->minimumSectionSize());
        pixelReminder = lengthToStretch % numberOfStretchedSections;
    }

    // ### The code below would be nicer if it was cleaned up a bit (since spans has been replaced with items)
    int spanStartSection = 0;
    int previousSectionLength = 0;

    QHeaderView::ResizeMode previousSectionResizeMode = QHeaderView::Interactive;

    // resize each section along the total length
    for (int i = 0; i < sectionCount(); ++i) {
        int oldSectionLength = headerSectionSize(i);
        int newSectionLength = -1;
        QHeaderView::ResizeMode newSectionResizeMode = headerSectionResizeMode(i);

        if (isVisualIndexHidden(i)) {
            newSectionLength = 0;
        } else {
            QHeaderView::ResizeMode resizeMode;
            if (useGlobalMode)
                resizeMode = globalMode;
            else
                resizeMode = (i == stretchSection
                              ? QHeaderView::Stretch
                              : newSectionResizeMode);
            if (resizeMode == QHeaderView::Stretch && stretchSectionLength != -1) {
                if (i == lastSectionVisualIdx)
                    newSectionLength = qMax(stretchSectionLength, lastSectionSize);
                else
                    newSectionLength = stretchSectionLength;
                if (pixelReminder > 0) {
                    newSectionLength += 1;
                    --pixelReminder;
                }
                section_sizes.removeFirst();
            } else {
                newSectionLength = section_sizes.takeFirst();
            }
        }

        //Q_ASSERT(newSectionLength > 0);
        if ((previousSectionResizeMode != newSectionResizeMode
            || previousSectionLength != newSectionLength) && i > 0) {
            createSectionItems(spanStartSection, i - 1, previousSectionLength, previousSectionResizeMode);
            //Q_ASSERT(headerLength() == length);
            spanStartSection = i;
        }

        if (newSectionLength != oldSectionLength)
            emit q->sectionResized(logicalIndex(i), oldSectionLength, newSectionLength);

        previousSectionLength = newSectionLength;
        previousSectionResizeMode = newSectionResizeMode;
    }

    createSectionItems(spanStartSection, sectionCount() - 1,
                       previousSectionLength, previousSectionResizeMode);
    //Q_ASSERT(headerLength() == length);
    resizeRecursionBlock = false;
    viewport->update();
}